

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZFYsmpMatrix<double>::TPZMThread>::Resize
          (TPZVec<TPZFYsmpMatrix<double>::TPZMThread> *this,int64_t newsize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TPZMThread *pTVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ostream *poVar10;
  TPZMThread *pTVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar10 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar14 = this->fNElements;
  if (lVar14 == newsize) {
    return;
  }
  if (newsize == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
    if (this->fStore != (TPZMThread *)0x0) {
      operator_delete__(this->fStore);
    }
    this->fStore = (TPZMThread *)0x0;
    return;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = newsize;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
    uVar13 = SUB168(auVar4 * ZEXT816(0x38),0);
  }
  pTVar11 = (TPZMThread *)operator_new__(uVar13);
  if (newsize <= lVar14) {
    lVar14 = newsize;
  }
  pTVar3 = this->fStore;
  if (lVar14 < 1) {
    if (pTVar3 == (TPZMThread *)0x0) goto LAB_00d71889;
  }
  else {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&pTVar11->fOpt + lVar12) = *(undefined8 *)((long)&pTVar3->fOpt + lVar12)
      ;
      puVar1 = (undefined8 *)((long)&pTVar3->target + lVar12);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pTVar3->fLasteq + lVar12);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pTVar3->fZ + lVar12);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pTVar11->fZ + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      puVar1 = (undefined8 *)((long)&pTVar11->fLasteq + lVar12);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      puVar1 = (undefined8 *)((long)&pTVar11->target + lVar12);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar12 = lVar12 + 0x38;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  operator_delete__(pTVar3);
LAB_00d71889:
  this->fStore = pTVar11;
  this->fNElements = newsize;
  this->fNAlloc = newsize;
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}